

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_unix.cpp
# Opt level: O2

bool __thiscall File::size(File *this,int64_t *fileSize)

{
  int iVar1;
  stat buf;
  stat64 sStack_98;
  
  iVar1 = (int)this->m_impl;
  if (iVar1 != -1) {
    iVar1 = fstat64(iVar1,&sStack_98);
    if (iVar1 == 0) {
      *fileSize = sStack_98.st_size;
    }
    return iVar1 == 0;
  }
  return false;
}

Assistant:

bool File::size(int64_t* const fileSize) const
{
    bool res = false;

    struct stat buf;

    if (isOpen() && (fstat(to_fd(m_impl), &buf) == 0))
    {
        *fileSize = buf.st_size;
        res = true;
    }

    return res;
}